

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void pbrt::syntactic::Attributes::push(SP *current)

{
  __shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2> _Stack_18;
  
  if ((current->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    std::make_shared<pbrt::syntactic::Attributes>();
  }
  else {
    std::make_shared<pbrt::syntactic::Attributes,std::shared_ptr<pbrt::syntactic::Attributes>&>
              ((shared_ptr<pbrt::syntactic::Attributes> *)&_Stack_18);
  }
  std::__shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&current->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_18._M_refcount);
  return;
}

Assistant:

static void push(Attributes::SP &current) {
        // Attributes::SP newGraphicsState = std::make_shared<Attributes>();
        // newGraphicsState->areaLightSources = graphicsState->areaLightSources;
        // newGraphicsState->mediumInterface = graphicsState->mediumInterface;
        // newGraphicsState->reverseOrientation = graphicsState->reverseOrientation;
        // newGraphicsState->parent = graphicsState;
        // graphicsState = newGraphicsState;
        current 
          = current.get()
          ? std::make_shared<Attributes>(current)
          : std::make_shared<Attributes>();
      }